

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void load(item *x)

{
  int iVar1;
  int local_14;
  int r;
  item *x_local;
  
  if (x->mode == 0x2c1) {
    if (x->lev == 0) {
      x->a = RISC_MEMSIZE + x->a;
    }
    if (x->hs == 0) {
      local_14 = getReg();
      put(0x20,local_14,x->r,x->a);
    }
    else {
      local_14 = getReg();
      put(0x28,x->hs,0,3);
      put(0x20,local_14,x->r,x->a);
      put(0x28,0,0,2);
      put(0x33,local_14,x->r,x->a);
      regs[x->hs] = 0;
    }
    regs[x->r] = 0;
    x->r = local_14;
  }
  else if (x->mode == 0x2c6) {
    if ((x->lev == 0) && (x->indLev == 0)) {
      x->a = RISC_MEMSIZE + x->a;
    }
    iVar1 = getReg();
    put(0x33,iVar1,x->r,x->a);
    regs[x->r] = 0;
    x->r = iVar1;
  }
  else if (x->mode == 0x2bd) {
    if (x->a == 0) {
      x->r = 0;
    }
    else {
      iVar1 = getReg();
      x->r = iVar1;
      put(0x10,x->r,0,x->a);
    }
  }
  x->mode = 0x2c2;
  return;
}

Assistant:

procedure 
void load(struct item *x) {
	variable int r;
	r = 0;
	
	/* load items based on their stack addr. */
	if (x->mode == CLASS_VAR) {
		if (x->lev == 0) {
			x->a = RISC_MEMSIZE + x->a;
		}

		/* cases: */
		/* (i) R[x->hs] == 0 => load addr. from heap */
		/* (ii) R[x->hs] == 1 => load addr. from stack */
		if (x->hs != 0) {
			r = getReg();
			put(RISC_BEQ,x->hs,0,3); 
			put(RISC_LDW,r,x->r,x->a); 
			put(RISC_BEQ,0,0,2);
			put(RISC_HLDW,r,x->r,x->a); 
			regs[x->hs] = 0;

		/* simply load variable into R[r] */
		} else {
			r = getReg();
			put(RISC_LDW,r,x->r,x->a);
		}
		regs[x->r] = 0;
		x->r = r;

	 /* record elements reside on heap */
	} elsif (x->mode == CLASS_IND) {
		if ((x->lev == 0) && (x->indLev == 0)) {
			x->a = RISC_MEMSIZE + x->a;	
		}
		r = getReg();
		put(RISC_HLDW,r,x->r,x->a);
		regs[x->r] = 0;
		x->r = r;

	/* constant stuff can be stored into R[r] */
	} elsif (x->mode == CLASS_CONST) {
		if (x->a == 0) {
			x->r = 0;
		} else {
			r = getReg();
			x->r = r;
			put(RISC_ADDI,x->r,0,x->a);
		}
	}
	x->mode = CLASS_REG;
}